

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O3

void __thiscall
mocker::anon_unknown_5::FindPureFunctions::operator()(FindPureFunctions *this,FuncDecl *node)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  peVar1 = (node->body).super___shared_ptr<mocker::ast::CompoundStmt,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  this_00 = (node->body).super___shared_ptr<mocker::ast::CompoundStmt,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  (*(peVar1->super_Statement).super_ASTNode._vptr_ASTNode[3])(peVar1,this);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    return;
  }
  return;
}

Assistant:

void operator()(const ast::FuncDecl &node) const override {
    visit(node.body);
  }